

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_24939c::ObjCProtoName::printLeft(ObjCProtoName *this,OutputStream *S)

{
  StringView local_48;
  char *local_38;
  char *local_30;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  ObjCProtoName *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  Node::print(this->Ty,S);
  StringView::StringView(&local_28,"<");
  OutputStream::operator+=(local_18,local_28);
  local_38 = (this->Protocol).First;
  local_30 = (this->Protocol).Last;
  OutputStream::operator+=(local_18,this->Protocol);
  StringView::StringView(&local_48,">");
  OutputStream::operator+=(local_18,local_48);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Ty->print(S);
    S += "<";
    S += Protocol;
    S += ">";
  }